

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncomingMessage.cpp
# Opt level: O0

void __thiscall DIS::IncomingMessage::IncomingMessage(IncomingMessage *this)

{
  IncomingMessage *this_local;
  
  IBufferProcessor::IBufferProcessor(&this->super_IBufferProcessor);
  (this->super_IBufferProcessor)._vptr_IBufferProcessor =
       (_func_int **)&PTR__IncomingMessage_00270f68;
  memset(&this->_processors,0,0x30);
  std::
  multimap<unsigned_char,_DIS::IPacketProcessor_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>_>
  ::multimap(&this->_processors);
  memset(&this->_pduBanks,0,0x30);
  std::
  multimap<unsigned_char,_DIS::IPduBank_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_DIS::IPduBank_*>_>_>
  ::multimap(&this->_pduBanks);
  return;
}

Assistant:

IncomingMessage::IncomingMessage()
: _processors(), _pduBanks()
{
}